

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  uint *puVar5;
  char local_b8 [8];
  char any_address [128];
  long lStack_30;
  int i;
  size_t sz;
  int opt;
  int sc;
  int sb;
  int rc;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _sb = argv;
  argv_local._0_4_ = argc;
  iVar2 = get_test_port(argc,argv);
  test_addr_from(socket_address,"ws","127.0.0.1",iVar2);
  iVar2 = get_test_port((int)argv_local,_sb);
  test_addr_from(local_b8,"ws","*",iVar2);
  opt = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                         ,0x5b,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                 ,0x5c,opt,local_b8);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                  ,0x5d,opt);
  sz._4_4_ = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                              ,0x61,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                    ,0x62,sz._4_4_,socket_address);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                  ,99,sz._4_4_);
  sz._4_4_ = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                              ,0x66,1,0x10);
  lStack_30 = 4;
  sc = nn_getsockopt(sz._4_4_,0xfffffffc,1,&sz,&stack0xffffffffffffffd0);
  pFVar1 = _stderr;
  if (sc != 0) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x6b);
    fflush(_stderr);
    nn_err_abort();
  }
  if (lStack_30 != 4) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (opt)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x6c);
    fflush(_stderr);
    nn_err_abort();
  }
  if ((int)sz != 2) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opt == NN_WS_MSG_TYPE_BINARY",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x6d);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(sz._4_4_,"ws://127.0.0.1");
  pFVar1 = _stderr;
  if (sc < 0) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x7a);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(sz._4_4_,"ws://*:");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x7e);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  pFVar1 = _stderr;
  if (iVar2 != 0x16) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x7f);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(sz._4_4_,"ws://*:1000000");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x81);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  pFVar1 = _stderr;
  if (iVar2 != 0x16) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x82);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(sz._4_4_,"ws://*:some_port");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x84);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(sz._4_4_,"ws://eth10000;127.0.0.1:5555");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x86);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  pFVar1 = _stderr;
  if (iVar2 != 0x13) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x87);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_bind(sz._4_4_,"ws://127.0.0.1:");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x8a);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  pFVar1 = _stderr;
  if (iVar2 != 0x16) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x8b);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_bind(sz._4_4_,"ws://127.0.0.1:1000000");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x8d);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  pFVar1 = _stderr;
  if (iVar2 != 0x16) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x8e);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_bind(sz._4_4_,"ws://eth10000:5555");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x90);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  pFVar1 = _stderr;
  if (iVar2 != 0x13) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x91);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(sz._4_4_,"ws://:5555");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x94);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  pFVar1 = _stderr;
  if (iVar2 != 0x16) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x95);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(sz._4_4_,"ws://-hostname:5555");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x97);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  pFVar1 = _stderr;
  if (iVar2 != 0x16) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x98);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(sz._4_4_,"ws://abc.123.---.#:5555");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x9a);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  pFVar1 = _stderr;
  if (iVar2 != 0x16) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x9b);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(sz._4_4_,"ws://[::1]:5555");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x9d);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  pFVar1 = _stderr;
  if (iVar2 != 0x16) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x9e);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(sz._4_4_,"ws://abc.123.:5555");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0xa0);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  pFVar1 = _stderr;
  if (iVar2 != 0x16) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0xa1);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(sz._4_4_,"ws://abc...123:5555");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0xa3);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  pFVar1 = _stderr;
  if (iVar2 != 0x16) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0xa4);
    fflush(_stderr);
    nn_err_abort();
  }
  sc = nn_connect(sz._4_4_,"ws://.123:5555");
  if (-1 < sc) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0xa6);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_errno();
  pFVar1 = _stderr;
  if (iVar2 != 0x16) {
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0xa7);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                  ,0xa9,sz._4_4_);
  nn_sleep(200);
  opt = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                         ,0xad,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                 ,0xae,opt,socket_address);
  sz._4_4_ = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                              ,0xaf,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                    ,0xb0,sz._4_4_,socket_address);
  nn_sleep(200);
  any_address[0x7c] = '\0';
  any_address[0x7d] = '\0';
  any_address[0x7e] = '\0';
  any_address[0x7f] = '\0';
  for (; any_address._124_4_ != 100; any_address._124_4_ = any_address._124_4_ + 1) {
    test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                   ,0xb8,sz._4_4_,"ABC");
    test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                   ,0xb9,opt,"ABC");
    test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                   ,0xbb,opt,"DEF");
    test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                   ,0xbc,sz._4_4_,"DEF");
  }
  any_address[0x7c] = '\0';
  any_address[0x7d] = '\0';
  any_address[0x7e] = '\0';
  any_address[0x7f] = '\0';
  for (; any_address._124_4_ != 100; any_address._124_4_ = any_address._124_4_ + 1) {
    test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                   ,0xc1,sz._4_4_,"0123456789012345678901234567890123456789");
  }
  any_address[0x7c] = '\0';
  any_address[0x7d] = '\0';
  any_address[0x7e] = '\0';
  any_address[0x7f] = '\0';
  for (; any_address._124_4_ != 100; any_address._124_4_ = any_address._124_4_ + 1) {
    test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                   ,0xc4,opt,"0123456789012345678901234567890123456789");
  }
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                  ,199,sz._4_4_);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                  ,200,opt);
  test_text();
  return 0;
}

Assistant:

int main (int argc, const char *argv[])
{
    int rc;
    int sb;
    int sc;
    int opt;
    size_t sz;
    int i;
    char any_address[128];

    test_addr_from(socket_address, "ws", "127.0.0.1",
            get_test_port(argc, argv));

    test_addr_from(any_address, "ws", "*",
            get_test_port(argc, argv));

    /*  Try closing bound but unconnected socket. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, any_address);
    test_close (sb);

    /*  Try closing a TCP socket while it not connected. At the same time
        test specifying the local address for the connection. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);
    test_close (sc);

    /*  Open the socket anew. */
    sc = test_socket (AF_SP, NN_PAIR);

    /*  Check socket options. */
    sz = sizeof (opt);
    rc = nn_getsockopt (sc, NN_WS, NN_WS_MSG_TYPE, &opt, &sz);
    errno_assert (rc == 0);
    nn_assert (sz == sizeof (opt));
    nn_assert (opt == NN_WS_MSG_TYPE_BINARY);

#if 0
    //opt = 100;
    //sz = sizeof (opt);
    //rc = nn_getsockopt (sc, NN_WS, NN_WS_HANDSHAKE_TIMEOUT, &opt, &sz);
    //errno_assert (rc == 0);
    //nn_assert (sz == sizeof (opt));
    //nn_assert (opt == 100);
#endif

    /*  Default port 80 should be assumed if not explicitly declared. */
    rc = nn_connect (sc, "ws://127.0.0.1");
    errno_assert (rc >= 0);

    /*  Try using invalid address strings. */
    rc = nn_connect (sc, "ws://*:");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://*:1000000");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://*:some_port");
    nn_assert (rc < 0);
    rc = nn_connect (sc, "ws://eth10000;127.0.0.1:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == ENODEV);

    rc = nn_bind (sc, "ws://127.0.0.1:");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_bind (sc, "ws://127.0.0.1:1000000");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_bind (sc, "ws://eth10000:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == ENODEV);

    rc = nn_connect (sc, "ws://:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://-hostname:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc.123.---.#:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://[::1]:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc.123.:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc...123:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://.123:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);

    test_close (sc);

    nn_sleep (200);

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);

    /*  Leave enough time for connection establishment. */
    nn_sleep (200);

    /*  Ping-pong test. */
    for (i = 0; i != 100; ++i) {

        test_send (sc, "ABC");
        test_recv (sb, "ABC");

        test_send (sb, "DEF");
        test_recv (sc, "DEF");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "0123456789012345678901234567890123456789");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (sb, "0123456789012345678901234567890123456789");
    }

    test_close (sc);
    test_close (sb);

    test_text ();

    return 0;
}